

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

floating_type * __thiscall
toml::basic_value<toml::type_config>::as_floating(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == floating) {
    return (floating_type *)&this->field_1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_floating()",&local_31);
  throw_bad_cast(this,&local_30,floating);
}

Assistant:

floating_type const& as_floating() const
    {
        if(this->type_ != value_t::floating)
        {
            this->throw_bad_cast("toml::value::as_floating()", value_t::floating);
        }
        return this->floating_.value;
    }